

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O2

void SummonActor(int command,int command2,FCommandLine *argv)

{
  bool bVar1;
  short it;
  int iVar2;
  int iVar3;
  int it_00;
  char *pcVar4;
  PClassActor *pPVar5;
  BYTE BVar6;
  int i;
  
  BVar6 = (BYTE)command;
  bVar1 = CheckCheatmode(true);
  if (!bVar1) {
    iVar2 = FCommandLine::argc(argv);
    if (1 < iVar2) {
      pcVar4 = FCommandLine::operator[](argv,1);
      pPVar5 = PClass::FindActor(pcVar4);
      if (pPVar5 == (PClassActor *)0x0) {
        pcVar4 = FCommandLine::operator[](argv,1);
        Printf("Unknown actor \'%s\'\n",pcVar4);
        return;
      }
      iVar2 = FCommandLine::argc(argv);
      if (2 < iVar2) {
        BVar6 = (BYTE)command2;
      }
      Net_WriteByte(BVar6);
      Net_WriteString(FName::NameData.NameArray
                      [(pPVar5->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      iVar2 = FCommandLine::argc(argv);
      if (2 < iVar2) {
        pcVar4 = FCommandLine::operator[](argv,2);
        iVar2 = atoi(pcVar4);
        Net_WriteWord((short)iVar2);
        iVar2 = FCommandLine::argc(argv);
        if (iVar2 < 4) {
          it = 0;
        }
        else {
          pcVar4 = FCommandLine::operator[](argv,3);
          iVar2 = atoi(pcVar4);
          it = (short)iVar2;
        }
        Net_WriteWord(it);
        iVar2 = FCommandLine::argc(argv);
        if (iVar2 < 5) {
          BVar6 = '\0';
        }
        else {
          pcVar4 = FCommandLine::operator[](argv,4);
          iVar2 = atoi(pcVar4);
          BVar6 = (BYTE)iVar2;
        }
        Net_WriteByte(BVar6);
        for (iVar2 = 5; iVar2 != 10; iVar2 = iVar2 + 1) {
          iVar3 = FCommandLine::argc(argv);
          it_00 = 0;
          if (iVar2 < iVar3) {
            pcVar4 = FCommandLine::operator[](argv,iVar2);
            it_00 = atoi(pcVar4);
          }
          Net_WriteLong(it_00);
        }
      }
    }
  }
  return;
}

Assistant:

static void SummonActor (int command, int command2, FCommandLine argv)
{
	if (CheckCheatmode ())
		return;

	if (argv.argc() > 1)
	{
		PClassActor *type = PClass::FindActor(argv[1]);
		if (type == NULL)
		{
			Printf ("Unknown actor '%s'\n", argv[1]);
			return;
		}
		Net_WriteByte (argv.argc() > 2 ? command2 : command);
		Net_WriteString (type->TypeName.GetChars());

		if (argv.argc () > 2)
		{
			Net_WriteWord (atoi (argv[2])); // angle
			Net_WriteWord ((argv.argc() > 3) ? atoi(argv[3]) : 0); // TID
			Net_WriteByte ((argv.argc() > 4) ? atoi(argv[4]) : 0); // special
			for (int i = 5; i < 10; i++)
			{ // args[5]
				Net_WriteLong((i < argv.argc()) ? atoi(argv[i]) : 0);
			}
		}
	}
}